

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O0

void __thiscall
slang::ast::SignalEventControl::serializeTo(SignalEventControl *this,ASTSerializer *serializer)

{
  ASTSerializer *in_RSI;
  long in_RDI;
  string_view sVar1;
  ASTSerializer *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  ASTSerializer *this_01;
  undefined4 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined8 local_18;
  
  this_00 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffa0,(char *)in_RSI);
  ASTSerializer::write(this_00,local_20,local_18,*(size_t *)(in_RDI + 0x20));
  this_01 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,(char *)this_00);
  sVar1 = ast::toString(None);
  local_40 = sVar1._M_len;
  ASTSerializer::write(this_01,local_30,local_28,local_40);
  if (*(long *)(in_RDI + 0x28) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_01,(char *)this_00);
    ASTSerializer::write(in_RSI,local_50,local_48,*(size_t *)(in_RDI + 0x28));
  }
  return;
}

Assistant:

void SignalEventControl::serializeTo(ASTSerializer& serializer) const {
    serializer.write("expr", expr);
    serializer.write("edge", toString(edge));

    if (iffCondition)
        serializer.write("iff", *iffCondition);
}